

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuasispeciesEdgeCalculator.cpp
# Opt level: O1

double __thiscall
QuasispeciesEdgeCalculator::singleOverlap
          (QuasispeciesEdgeCalculator *this,AlignmentRecord *ap1,AlignmentRecord *ap2,int strain1,
          int strain2,double MIN_OVERLAP,double cutoff)

{
  _Rb_tree_header *p_Var1;
  byte bVar2;
  byte bVar3;
  double dVar4;
  pointer pcVar5;
  pointer pcVar6;
  pointer pcVar7;
  char cVar8;
  char cVar9;
  uint uVar10;
  uint uVar11;
  uint s2;
  uint e2;
  int iVar12;
  ShortDnaSequence *pSVar13;
  vector<char,_std::allocator<char>_> *pvVar14;
  size_t sVar15;
  mapped_type_conflict *pmVar16;
  _Base_ptr p_Var17;
  int iVar18;
  _Base_ptr p_Var19;
  long lVar20;
  ulong uVar21;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *pmVar22;
  uint e1;
  ulong uVar23;
  ulong pos;
  ulong uVar24;
  ulong uVar25;
  uint s1;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  undefined4 uVar29;
  undefined4 uVar30;
  _Base_ptr local_198;
  int j_global;
  double local_188;
  ulong local_180;
  vector<char,_std::allocator<char>_> local_178;
  _Base_ptr local_160;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_158;
  QuasispeciesEdgeCalculator *local_150;
  vector<char,_std::allocator<char>_> local_148;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_128;
  ulong local_120;
  double local_118;
  double local_110;
  int offset2;
  int offset1;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_100;
  _Base_ptr local_f8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_f0;
  _Base_ptr local_e8;
  map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_> *local_e0;
  ShortDnaSequence sequence2;
  ShortDnaSequence sequence1;
  int overlap;
  
  local_188 = MIN_OVERLAP;
  local_150 = this;
  local_110 = cutoff;
  ShortDnaSequence::ShortDnaSequence(&sequence1);
  local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  ShortDnaSequence::ShortDnaSequence(&sequence2);
  local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (strain1 == 2) {
    uVar10 = AlignmentRecord::getStart2(ap1);
    uVar11 = AlignmentRecord::getEnd2(ap1);
    pSVar13 = AlignmentRecord::getSequence2(ap1);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence1.forward,&pSVar13->forward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence1.forward_qualities,&pSVar13->forward_qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence1.backward,&pSVar13->backward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence1.backward_qualities,&pSVar13->backward_qualities);
    pvVar14 = AlignmentRecord::getCigar2Unrolled(ap1);
    std::vector<char,_std::allocator<char>_>::operator=(&local_178,pvVar14);
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
    if (strain1 == 1) {
      uVar10 = AlignmentRecord::getStart1(ap1);
      uVar11 = AlignmentRecord::getEnd1(ap1);
      pSVar13 = AlignmentRecord::getSequence1(ap1);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence1.forward,&pSVar13->forward);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence1.forward_qualities,&pSVar13->forward_qualities);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence1.backward,&pSVar13->backward);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence1.backward_qualities,&pSVar13->backward_qualities);
      pvVar14 = AlignmentRecord::getCigar1Unrolled(ap1);
      std::vector<char,_std::allocator<char>_>::operator=(&local_178,pvVar14);
    }
  }
  if (strain2 == 2) {
    s2 = AlignmentRecord::getStart2(ap2);
    e2 = AlignmentRecord::getEnd2(ap2);
    pSVar13 = AlignmentRecord::getSequence2(ap2);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence2.forward,&pSVar13->forward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence2.forward_qualities,&pSVar13->forward_qualities);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence2.backward,&pSVar13->backward);
    boost::
    shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    operator=(&sequence2.backward_qualities,&pSVar13->backward_qualities);
    pvVar14 = AlignmentRecord::getCigar2Unrolled(ap2);
    std::vector<char,_std::allocator<char>_>::operator=(&local_148,pvVar14);
  }
  else {
    s2 = 0;
    e2 = 0;
    if (strain2 == 1) {
      s2 = AlignmentRecord::getStart1(ap2);
      e2 = AlignmentRecord::getEnd1(ap2);
      pSVar13 = AlignmentRecord::getSequence1(ap2);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence2.forward,&pSVar13->forward);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence2.forward_qualities,&pSVar13->forward_qualities);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence2.backward,&pSVar13->backward);
      boost::
      shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      operator=(&sequence2.backward_qualities,&pSVar13->backward_qualities);
      pvVar14 = AlignmentRecord::getCigar1Unrolled(ap2);
      std::vector<char,_std::allocator<char>_>::operator=(&local_148,pvVar14);
    }
  }
  e1 = uVar11;
  s1 = uVar10;
  if ((int)s2 < (int)uVar10) {
    std::swap<ShortDnaSequence>(&sequence1,&sequence2);
    pcVar7 = local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pcVar6 = local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pcVar5 = local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
    local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_start = pcVar5;
    local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar6;
    local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = pcVar7;
    e1 = e2;
    e2 = uVar11;
    s1 = s2;
    s2 = uVar10;
  }
  offset1 = 0;
  offset2 = 0;
  overlap = 0;
  computeOffsets((QuasispeciesEdgeCalculator *)&offset2,s1,s2,e1,e2,&offset1,&offset2,&overlap);
  iVar18 = offset1;
  local_198 = (_Base_ptr)0x0;
  if (((local_188 <= (double)overlap) &&
      (uVar23 = (ulong)offset1, sVar15 = ShortDnaSequence::size(&sequence1), uVar23 < sVar15)) &&
     (uVar23 = (ulong)offset2, sVar15 = ShortDnaSequence::size(&sequence2), uVar23 < sVar15)) {
    pos = 0;
    uVar24 = 0;
    uVar27 = 0;
    uVar23 = 0;
    while( true ) {
      do {
      } while ((ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) <= uVar23 ||
               (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) <= uVar27);
      cVar8 = local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar27];
      if (((cVar8 != 'H') && (cVar8 != 'S')) &&
         ((local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start[uVar23] != 'H' &&
          (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
           ._M_start[uVar23] != 'S')))) break;
      pos = pos + (cVar8 == 'S');
      lVar26 = uVar27 + (cVar8 == 'S');
      uVar24 = uVar24 + (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar23] == 'S');
      lVar20 = uVar23 + (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data._M_start[uVar23] == 'S');
      uVar27 = lVar26 + (ulong)(local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar26] == 'H');
      uVar23 = lVar20 + (ulong)(local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                super__Vector_impl_data._M_start[lVar20] == 'H');
    }
    local_118 = 0.0;
    local_120 = 0;
    if (iVar18 == 0) {
      local_180 = 0;
      local_188 = 0.0;
    }
    else {
      pmVar22 = &local_150->SIMPSON_MAP;
      local_160 = &(local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header;
      local_158 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                   *)(ulong)(uint)-iVar18;
      iVar18 = 0;
      local_188 = 0.0;
      local_180 = 0;
      do {
        uVar21 = uVar27;
        lVar20 = 0;
        while ((ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) <= uVar21 + lVar20) {
          lVar20 = lVar20 + 1;
          if (iVar18 + (int)local_158 + (int)lVar20 == 0) {
            uVar27 = uVar21 + lVar20;
            goto LAB_00156f44;
          }
        }
        if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[lVar20 + uVar21] == 'I') {
LAB_00156e68:
          pos = pos + 1;
        }
        else if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar20 + uVar21] == 'M') {
          if (((local_110 != 1.0) || (NAN(local_110))) &&
             (j_global = s1 + (int)local_180,
             (local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
             local_160)) {
            p_Var17 = local_160;
            for (p_Var19 = (local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header.
                           _M_parent; p_Var19 != (_Base_ptr)0x0;
                p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < j_global]) {
              if (j_global <= (int)p_Var19[1]._M_color) {
                p_Var17 = p_Var19;
              }
            }
            p_Var19 = local_160;
            if ((p_Var17 != local_160) && (p_Var19 = p_Var17, j_global < (int)p_Var17[1]._M_color))
            {
              p_Var19 = local_160;
            }
            if (p_Var19 != local_160) {
              local_128 = pmVar22;
              pmVar16 = std::
                        map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                        ::at(pmVar22,&j_global);
              dVar4 = log(*pmVar16);
              local_188 = local_188 + dVar4;
              pmVar22 = local_128;
            }
          }
          local_180 = (ulong)((int)local_180 + 1);
          goto LAB_00156e68;
        }
        iVar12 = iVar18 + (int)lVar20;
        iVar18 = iVar18 + (int)lVar20 + 1;
        uVar27 = uVar21 + lVar20 + 1;
      } while (iVar12 + (int)local_158 != -1);
      uVar27 = uVar21 + lVar20 + 1;
    }
LAB_00156f44:
    if (uVar27 < (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              super__Vector_impl_data._M_start)) {
      local_120 = 0;
      local_118 = 0.0;
      uVar21 = uVar23;
      uVar28 = uVar27;
      do {
        uVar23 = uVar21;
        uVar27 = uVar28;
        if (((((ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                      (long)local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start) <= uVar21) ||
             (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar28] == 'S')) ||
            (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar21] == 'S')) ||
           ((sVar15 = ShortDnaSequence::size(&sequence1), sVar15 <= pos ||
            (sVar15 = ShortDnaSequence::size(&sequence2), sVar15 <= uVar24)))) break;
        if ((local_110 != 1.0) || (NAN(local_110))) {
          bVar2 = local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar28];
          bVar3 = local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar21];
          uVar25 = uVar24;
          if (bVar2 == bVar3) {
            if ((bVar2 | 4) == 0x4d) {
              local_198 = (_Base_ptr)ShortDnaSequence::qualityCorrect(&sequence1,pos);
              local_158 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)ShortDnaSequence::qualityCorrect(&sequence2,uVar24);
              cVar8 = ShortDnaSequence::operator[](&sequence1,pos);
              cVar9 = ShortDnaSequence::operator[](&sequence2,uVar24);
              local_160 = (_Base_ptr)((1.0 - (double)local_198) / 3.0);
              p_Var19 = local_198;
              if (cVar8 != 'A') {
                p_Var19 = local_160;
              }
              local_128 = (map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                           *)((1.0 - (double)local_158) / 3.0);
              local_e0 = local_158;
              if (cVar9 != 'A') {
                local_e0 = local_128;
              }
              cVar8 = ShortDnaSequence::operator[](&sequence1,pos);
              cVar9 = ShortDnaSequence::operator[](&sequence2,uVar24);
              local_e8 = local_198;
              if (cVar8 != 'C') {
                local_e8 = local_160;
              }
              local_f0 = local_158;
              if (cVar9 != 'C') {
                local_f0 = local_128;
              }
              cVar8 = ShortDnaSequence::operator[](&sequence1,pos);
              cVar9 = ShortDnaSequence::operator[](&sequence2,uVar24);
              local_f8 = local_198;
              if (cVar8 != 'G') {
                local_f8 = local_160;
              }
              local_100 = local_158;
              if (cVar9 != 'G') {
                local_100 = local_128;
              }
              cVar8 = ShortDnaSequence::operator[](&sequence1,pos);
              cVar9 = ShortDnaSequence::operator[](&sequence2,uVar24);
              if (cVar8 != 'T') {
                local_198 = local_160;
              }
              if (cVar9 != 'T') {
                local_158 = local_128;
              }
              dVar4 = log((double)local_f8 * (double)local_100 +
                          (double)local_e8 * (double)local_f0 +
                          (double)p_Var19 * (double)local_e0 + 0.0 +
                          (double)local_198 * (double)local_158);
              local_188 = local_188 + dVar4;
              local_118 = local_118 + 1.0;
              uVar27 = uVar28 + 1;
              pos = pos + 1;
              uVar23 = uVar21 + 1;
              uVar25 = uVar24 + 1;
              if ((uVar27 < (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_178.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start)) &&
                 (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar27] == 'M')) {
                local_180 = (ulong)((int)local_180 + 1);
LAB_0015731e:
                local_120 = (ulong)((int)local_120 + 1);
                uVar23 = uVar21 + 1;
                uVar25 = uVar24 + 1;
                uVar27 = uVar28 + 1;
              }
            }
            else {
              if ((bVar2 != 0x44) || (bVar3 != 0x44)) goto LAB_001572f3;
              uVar23 = uVar21 + 1;
              uVar27 = uVar28 + 1;
            }
          }
          else {
LAB_001572f3:
            if (local_150->FRAMESHIFT_MERGE != true) goto LAB_00157622;
            if (bVar3 == 0x4d) {
              if (bVar2 == 0x49) {
                pos = pos + 1;
                uVar27 = uVar28 + 1;
              }
              else if (bVar2 == 0x44) goto LAB_0015731e;
            }
            else {
              local_198 = (_Base_ptr)0x0;
              if (bVar2 != 0x4d) goto LAB_001573dd;
              if (bVar3 == 0x49) goto LAB_0015700f;
              if (bVar3 == 0x44) {
                uVar23 = uVar21 + 1;
                uVar27 = uVar28 + 1;
                pos = pos + 1;
                local_180 = (ulong)((int)local_180 + 1);
              }
            }
          }
        }
        else {
          cVar8 = ShortDnaSequence::operator[](&sequence1,pos);
          cVar9 = ShortDnaSequence::operator[](&sequence2,uVar24);
          if (cVar8 != cVar9) {
LAB_00157622:
            uVar29 = 0;
            uVar30 = 0;
            goto LAB_001573d8;
          }
          uVar28 = uVar28 + 1;
          pos = pos + 1;
LAB_0015700f:
          uVar23 = uVar21 + 1;
          uVar25 = uVar24 + 1;
          uVar27 = uVar28;
        }
        uVar21 = uVar23;
        uVar24 = uVar25;
        uVar28 = uVar27;
      } while (uVar27 < (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_178.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start));
    }
    if ((local_110 != 1.0) || (NAN(local_110))) {
      if ((uVar27 < (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_finish -
                           (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                 super__Vector_impl_data._M_start)) &&
         (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar27] != 'S')) {
        if (uVar27 < (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl
                                   .super__Vector_impl_data._M_finish -
                            (long)local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                  super__Vector_impl_data._M_start)) {
          pmVar22 = &local_150->SIMPSON_MAP;
          p_Var1 = &(local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header;
          uVar23 = local_180;
          do {
            if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar27] == 'M') {
              j_global = (int)uVar23 + s1;
              if ((_Rb_tree_header *)
                  (local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                  p_Var1) {
                p_Var19 = (local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_parent;
                p_Var17 = &p_Var1->_M_header;
                for (; p_Var19 != (_Base_ptr)0x0;
                    p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < j_global]) {
                  if (j_global <= (int)p_Var19[1]._M_color) {
                    p_Var17 = p_Var19;
                  }
                }
                p_Var19 = &p_Var1->_M_header;
                if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                   (p_Var19 = p_Var17, j_global < (int)p_Var17[1]._M_color)) {
                  p_Var19 = &p_Var1->_M_header;
                }
                if ((_Rb_tree_header *)p_Var19 != p_Var1) {
                  pmVar16 = std::
                            map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                            ::at(pmVar22,&j_global);
                  dVar4 = log(*pmVar16);
                  local_188 = local_188 + dVar4;
                }
              }
              uVar23 = (ulong)((int)uVar23 + 1);
            }
            else if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar27] == 'S') break;
            uVar27 = uVar27 + 1;
          } while (uVar27 < (ulong)((long)local_178.super__Vector_base<char,_std::allocator<char>_>.
                                          _M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_178.super__Vector_base<char,_std::allocator<char>_>.
                                         _M_impl.super__Vector_impl_data._M_start));
        }
      }
      else if (((uVar23 < (ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start)) &&
               (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start[uVar23] != 'S')) &&
              (uVar23 < (ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                      _M_impl.super__Vector_impl_data._M_finish -
                               (long)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                     _M_impl.super__Vector_impl_data._M_start))) {
        pmVar22 = &local_150->SIMPSON_MAP;
        p_Var1 = &(local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header;
        uVar24 = local_120;
        do {
          if (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar23] == 'M') {
            j_global = s2 + (int)uVar24;
            if ((_Rb_tree_header *)
                (local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
                p_Var1) {
              p_Var19 = (local_150->SIMPSON_MAP)._M_t._M_impl.super__Rb_tree_header._M_header.
                        _M_parent;
              p_Var17 = &p_Var1->_M_header;
              for (; p_Var19 != (_Base_ptr)0x0;
                  p_Var19 = (&p_Var19->_M_left)[(int)p_Var19[1]._M_color < j_global]) {
                if (j_global <= (int)p_Var19[1]._M_color) {
                  p_Var17 = p_Var19;
                }
              }
              p_Var19 = &p_Var1->_M_header;
              if (((_Rb_tree_header *)p_Var17 != p_Var1) &&
                 (p_Var19 = p_Var17, j_global < (int)p_Var17[1]._M_color)) {
                p_Var19 = &p_Var1->_M_header;
              }
              if ((_Rb_tree_header *)p_Var19 != p_Var1) {
                pmVar16 = std::
                          map<int,_double,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                          ::at(pmVar22,&j_global);
                dVar4 = log(*pmVar16);
                local_188 = local_188 + dVar4;
              }
            }
            uVar24 = (ulong)((int)uVar24 + 1);
          }
          else if (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar23] == 'S') break;
          uVar23 = uVar23 + 1;
        } while (uVar23 < (ulong)((long)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                        _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.super__Vector_base<char,_std::allocator<char>_>.
                                       _M_impl.super__Vector_impl_data._M_start));
      }
    }
    local_198 = (_Base_ptr)0x3ff0000000000000;
    if ((local_110 != 1.0) || (NAN(local_110))) {
      dVar4 = exp(local_188);
      dVar4 = pow(dVar4,1.0 / local_118);
      uVar29 = SUB84(dVar4,0);
      uVar30 = (undefined4)((ulong)dVar4 >> 0x20);
LAB_001573d8:
      local_198 = (_Base_ptr)CONCAT44(uVar30,uVar29);
    }
  }
LAB_001573dd:
  if (local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ShortDnaSequence::~ShortDnaSequence(&sequence2);
  if (local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  ShortDnaSequence::~ShortDnaSequence(&sequence1);
  return (double)local_198;
}

Assistant:

double QuasispeciesEdgeCalculator::singleOverlap(const AlignmentRecord & ap1, const AlignmentRecord & ap2, int strain1, int strain2, double MIN_OVERLAP, const double cutoff) const {
    int e1 = 0;
    int s1 = 0;
    ShortDnaSequence sequence1;
    vector<char> cigar1;

    int e2 = 0;
    int s2 = 0;
    ShortDnaSequence sequence2;
    vector<char> cigar2;

    if (strain1 == 1) {
        s1 = ap1.getStart1();
        e1 = ap1.getEnd1();
        sequence1 = ap1.getSequence1();
        cigar1 = ap1.getCigar1Unrolled();
    } else if (strain1 == 2) {
        s1 = ap1.getStart2();
        e1 = ap1.getEnd2();
        sequence1 = ap1.getSequence2();
        cigar1 = ap1.getCigar2Unrolled();
    }
    if (strain2 == 1) {
        s2 = ap2.getStart1();
        e2 = ap2.getEnd1();
        sequence2 = ap2.getSequence1();
        cigar2 = ap2.getCigar1Unrolled();
    } else if (strain2 == 2) {
        s2 = ap2.getStart2();
        e2 = ap2.getEnd2();
        sequence2 = ap2.getSequence2();
        cigar2 = ap2.getCigar2Unrolled();
    }

    if (s2 < s1) {
        std::swap(s1,s2);
        std::swap(e1,e2);
        std::swap(sequence1,sequence2);
        std::swap(cigar1,cigar2);
    }

    // ====
    // compute overlap
    int offset1 = 0;
    int offset2 = 0;
    int overlap = 0;
    computeOffsets(s1, s2, e1, e2, offset1, offset2, overlap);

    if (offset2 > 0) {
        //cerr << "offset 2: " << offset2 << endl;
    }
    //cerr << "offset 1: " << offset1 << endl;
    //cerr << "offset 2: " << offset2 << endl;
    //cerr << "single overlap: " << overlap << endl;
    if (overlap < MIN_OVERLAP) {
        return 0;
    }

    // ====
    //Offsets for the deletions and insertions that occured
    //upstream of the overlap. They cause index errors if not fixed.
    int offset_deletion1_ = 0;
    int offset_deletion2_ = 0;

    double overlap_probability = 0.0;
    char alphabet[] = {'A', 'C', 'G', 'T'};
    double hamming = 0;
    double total_size = 0;
    if (offset1 >= sequence1.size() || offset2 >= sequence2.size()) {
        return 0;
    }
    ////cerr << offset1 << " offset " << offset2 << endl;
    bool perfect = cutoff == 1.0;

    unsigned long j_seq = 0, j_seq2 = 0;
    unsigned long j_cigar = 0, j_cigar2 = 0;
    int j = 0, j2 = 0;
    for (;;) {
        if(j_cigar < cigar1.size() && j_cigar2 < cigar2.size()) {

            if (cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && cigar1[j_cigar] != 'H' && cigar2[j_cigar2] != 'H') break;
            if (cigar1[j_cigar] == 'S') { j_cigar++; j_seq++; }
            if (cigar2[j_cigar2] == 'S') { j_cigar2++; j_seq2++; }
            if (cigar1[j_cigar] == 'H') { j_cigar++; }
            if (cigar2[j_cigar2] == 'H') { j_cigar2++; }
        }
    }
    for (int j_prefix = 0;;) {
        if (j_prefix == offset1) break;
        if(j_cigar >= cigar1.size()) {
            int _ = 0;
            j_cigar++;
            j_prefix++;
            continue;
        }
        switch (cigar1[j_cigar]) {
            case 'M': 
                if (!perfect) {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                }
                j++;
            case 'I':
                j_seq++;
            default: break;
        }
        j_cigar++;
        j_prefix++;
    }
    for (;j_cigar<cigar1.size() && j_cigar2<cigar2.size() && cigar1[j_cigar] != 'S' && cigar2[j_cigar2] != 'S' && j_seq < sequence1.size() && j_seq2 < sequence2.size();) {
        //cerr << cigar1[j_cigar] << cigar2[j_cigar2] << "\t"; 
        if (perfect) {
            if (sequence1[j_seq] != sequence2[j_seq2]) return 0;
            else {
                j_cigar++;
                j_cigar2++;
                j_seq++;
                j_seq2++;
            }
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && (cigar1[j_cigar] == 'M' || cigar1[j_cigar] == 'I')) {

            //cerr << sequence1[j_seq] << ":" << sequence2[j_seq2];
            double q_x1 = sequence1.qualityCorrect(j_seq);
            // if (q_x1 < 0.001) {
            //     q_x1 = 0.001;
            // }
            double q_x2 = sequence2.qualityCorrect(j_seq2);
            // if (q_x2 < 0.001) {
            //     q_x2 = 0.001;
            // }
            //cerr << "\t" << q_x1 << ":" << q_x2 << "\t";
            double anti_q_x1 = (1.0 - q_x1) / 3.0;
            double anti_q_x2 = (1.0 - q_x2) / 3.0;
            assert(q_x1 <= 1 && q_x2 <= 1);
            double sum = 0.0;
            sum += ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2));
            sum += ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1) * (sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2));
            overlap_probability += log(sum);
            //cerr << "\t" << overlap_probability;
            total_size++;

            //cerr << sum << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[0] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[0] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[1] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[1] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[2] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[2] ? q_x2 : anti_q_x2)) << "\t";
            //cerr << ((sequence1[j_seq] == alphabet[3] ? q_x1 : anti_q_x1)) << ":" << ((sequence2[j_seq2] == alphabet[3] ? q_x2 : anti_q_x2)) << "\t";

            j_cigar++;
            j_cigar2++;
            j_seq++;
            j_seq2++;

            if (j_cigar < cigar1.size() && cigar1[j_cigar] == 'M') {
                j++;
                j2++;
            } 
        } else if (cigar1[j_cigar] == cigar2[j_cigar2] && cigar1[j_cigar] == 'D') {
            j_cigar++;
            j_cigar2++;
        }else if (this->FRAMESHIFT_MERGE) {
            if (cigar2[j_cigar2] == 'M') {
                switch(cigar1[j_cigar]) {
                    case 'D':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar++;
                        j_cigar2++;
                        j_seq2++;
                        j2++;
                        break;
                    case 'I':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar++;
                        j_seq++;
                        break;
                    default: break;
                }
            } else if (cigar1[j_cigar] == 'M') {
                switch(cigar2[j_cigar2]) {
                    case 'D':
                        //cerr << sequence1[j_seq] << ":-";  
                        j_cigar2++;
                        j_cigar++;
                        j_seq++;
                        j++;
                        break;
                    case 'I':
                        //cerr << "-:" << sequence2[j_seq2];  
                        j_cigar2++;
                        j_seq2++;
                        break;
                }
            } else {
                //cerr << "DOES NOT MATCH" << endl;
                return 0;
            }
        } else {
            return 0;
        }
        //cerr << endl;
    }
    if (!perfect) {
        if (j_cigar < cigar1.size() && cigar1[j_cigar] != 'S') {
            for (;j_cigar<cigar1.size();) {
                if (cigar1[j_cigar] == 'S') break;
                if (cigar1[j_cigar] == 'M') {
                    int j_global = s1+j;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j++;
                }
                j_cigar++;
            }
        } else if (j_cigar2 < cigar2.size() && cigar2[j_cigar2] != 'S') {
            for (;j_cigar2<cigar2.size();) {
                if (cigar2[j_cigar2] == 'S') break;
                if (cigar2[j_cigar2] == 'M') {
                    //if (j_cigar >= 26){
                    //    cerr << s2 << endl;
                    //    cerr << j2 << endl;
                    //    cerr << s2+j2 << endl;
                    //}
                    int j_global = s2+j2;
                    if (this->SIMPSON_MAP.begin() != this->SIMPSON_MAP.end()
                        && this->SIMPSON_MAP.find(j_global) != this->SIMPSON_MAP.end()) {
                        overlap_probability += log(this->SIMPSON_MAP.at(j_global));
                        //cerr << overlap_probability << endl;
                    }
                    j2++;
                }
                j_cigar2++;
            }
        }
    }
    //cerr << pow(exp(overlap_probability),1.0/total_size) << endl;
    if (perfect) return 1;
    return pow(exp(overlap_probability),1.0/total_size);
}